

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_receive_ping_frame(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  cio_websocket *websocket;
  cio_error cVar2;
  char data [5];
  undefined4 local_50;
  undefined1 local_4c;
  ws_frame local_48;
  undefined4 local_28;
  undefined8 local_24;
  undefined8 uStack_1c;
  undefined4 local_14;
  undefined2 local_10;
  
  local_48.data = &local_50;
  local_4c = 0;
  local_50 = 0x61616161;
  local_48.frame_type = CIO_WEBSOCKET_PING_FRAME;
  local_48.direction = FROM_CLIENT;
  local_48.data_length = 5;
  local_48.last_frame = true;
  local_48.rsv = false;
  local_28 = 8;
  local_24 = 0;
  uStack_1c = 0;
  local_14 = 0;
  local_10 = 1;
  serialize_frames(&local_48,2);
  websocket = ws;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  cVar2 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Could not start reading a message!",0x525,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x527,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x528,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_val != (void *)0x0) {
    UnityFail("context parameter of read_handler not correct",0x529);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not correct",0x52a,
             UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg4_val != (uint8_t *)0x0) {
    UnityFail("data parameter of read_handler not correct",0x52b);
  }
  UnityAssertEqualNumber
            (0,read_handler_fake.arg5_val,"length parameter of read_handler not correct",0x52c,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x52e,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,(ulong)on_control_fake.call_count,
             "on_control callback was not called twice (for ping and close)",0x530,
             UNITY_DISPLAY_STYLE_INT);
  if (on_control_fake.arg0_history[0] == (cio_websocket *)0x0) {
    UnityFail("websocket parameter of control callback (ping) is NULL",0x531);
  }
  UnityAssertEqualNumber
            (9,(ulong)on_control_fake.arg1_history[0],
             "type parameter of control callback (ping) is not PING",0x532,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (5,(ulong)on_control_fake.arg3_history[0],
             "data length parameter of control callback (ping) is not correct",0x533,
             UNITY_DISPLAY_STYLE_INT);
  if (on_control_fake.arg0_history[1] != (cio_websocket *)0x0) {
    UnityAssertEqualNumber
              (8,(ulong)on_control_fake.arg1_history[1],
               "type parameter of control callback (close) is not CLOSE",0x536,
               UNITY_DISPLAY_STYLE_INT);
    if (on_control_fake.arg2_history[1] == (uint8_t *)0x0) {
      UnityAssertEqualNumber
                (0,(ulong)on_control_fake.arg3_history[1],
                 "data length parameter of control callback (close) is not correct",0x538,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualMemory
                (&local_50,read_back_buffer,5,1,"data in ping frame callback not correct",0x53a,
                 UNITY_ARRAY_TO_ARRAY);
      return;
    }
    UnityFail("data parameter of control callback (close) is not NULL",0x537);
  }
  UnityFail("websocket parameter of control callback (close) is NULL",0x535);
}

Assistant:

static void test_receive_ping_frame(void)
{
	char data[] = "aaaa";

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_PING_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg4_val, "data parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(0, read_handler_fake.arg5_val, "length parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(2, on_control_fake.call_count, "on_control callback was not called twice (for ping and close)");
	TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_history[0], "websocket parameter of control callback (ping) is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_PING_FRAME, on_control_fake.arg1_history[0], "type parameter of control callback (ping) is not PING");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), on_control_fake.arg3_history[0], "data length parameter of control callback (ping) is not correct");

	TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_history[1], "websocket parameter of control callback (close) is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_history[1], "type parameter of control callback (close) is not CLOSE");
	TEST_ASSERT_NULL_MESSAGE(on_control_fake.arg2_history[1], "data parameter of control callback (close) is not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.arg3_history[1], "data length parameter of control callback (close) is not correct");

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, read_back_buffer, sizeof(data), "data in ping frame callback not correct");
}